

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O0

void __thiscall
module_level_txt_actions::module2(module_level_txt_actions *this,string *module,int level)

{
  ostream *poVar1;
  int level_local;
  string *module_local;
  module_level_txt_actions *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout," ");
  poVar1 = std::operator<<(poVar1,(string *)module);
  std::operator<<(poVar1,"(");
  if (level < 0x3fffffff) {
    std::ostream::operator<<((ostream *)&std::cout,level);
  }
  else {
    std::operator<<((ostream *)&std::cout,"-");
  }
  std::operator<<((ostream *)&std::cout,")");
  return;
}

Assistant:

void module2( std::string const & module, int level )
    {
        std::cout << " " << module << "(";

        if( level >= unknown_level )
        {
            std::cout << "-";
        }
        else
        {
            std::cout << level;
        }

        std::cout << ")";
    }